

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endian.h
# Opt level: O0

uint32_t upb_BigEndian32(uint32_t val)

{
  _Bool _Var1;
  uint local_c;
  uint32_t val_local;
  
  _Var1 = upb_IsLittleEndian();
  local_c = val;
  if (!_Var1) {
    local_c = val << 0x18 | (val & 0xff00) << 8 | (val & 0xff0000) >> 8 | val >> 0x18;
  }
  return local_c;
}

Assistant:

UPB_INLINE uint32_t upb_BigEndian32(uint32_t val) {
  if (upb_IsLittleEndian()) return val;

  return ((val & 0xff) << 24) | ((val & 0xff00) << 8) |
         ((val & 0xff0000) >> 8) | ((val & 0xff000000) >> 24);
}